

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_PersonHandle.cpp
# Opt level: O0

int __thiscall mbc::Val::PersonHandle::remove(PersonHandle *this,char *__filename)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>_>_>
  *this_00;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  int iVar1;
  Str *pSVar2;
  undefined4 extraout_var;
  iterator __position;
  undefined4 extraout_var_00;
  const_iterator local_48;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  iterator local_30;
  _List_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it_order;
  iterator it_persons;
  PersonHandle *this_local;
  
  if ((*(this->super_ValBase).is_vaild_ & 1U) != 0) {
    this_00 = this->mb_->persons_;
    pSVar2 = Person::ID(this->person_);
    iVar1 = (*(pSVar2->super__ValAtom).super_ValBase._vptr_ValBase[4])();
    __position = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>_>_>
                 ::find(this_00,(key_type *)CONCAT44(extraout_var,iVar1));
    it_order._M_node =
         (_List_node_base *)
         std::
         map<std::__cxx11::string,mbc::Val::Person*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,mbc::Val::Person*>>>
         ::erase_abi_cxx11_((map<std::__cxx11::string,mbc::Val::Person*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,mbc::Val::Person*>>>
                             *)this->mb_->persons_,__position);
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(this->mb_->order_);
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(this->mb_->order_);
    pSVar2 = Person::ID(this->person_);
    iVar1 = (*(pSVar2->super__ValAtom).super_ValBase._vptr_ValBase[4])();
    local_30._M_node =
         (_List_node_base *)
         std::find<std::_List_iterator<std::__cxx11::string>,std::__cxx11::string>
                   (local_38,local_40,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(extraout_var_00,iVar1));
    this_01 = this->mb_->order_;
    std::
    _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_List_const_iterator(&local_48,&local_30);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(this_01,local_48);
    MessageBook::save(this->mb_);
    reset_(this);
  }
  return (int)this;
}

Assistant:

PersonHandle& PersonHandle::remove() {
    if(*is_vaild_) {
        // remove self in mb_ -> persons_
        auto it_persons = mb_ -> persons_ -> find(person_ -> ID().raw());
        mb_ -> persons_ -> erase(it_persons);

        // remove self in mb_ -> order_
        auto it_order = std::find(mb_->order_->begin(), mb_->order_->end(), 
                                 person_ -> ID().raw() );
        mb_ -> order_ -> erase(it_order);

        // save messagebook and reset self, now it is unvaild
        mb_ -> save();
        reset_();
    } else {
        ; // do nothing
    }
    return *this;
}